

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilEnum.c
# Opt level: O0

void Abc_EnumPrintOne(Abc_EnuMan_t *p)

{
  char *pcVar1;
  char *pcVar2;
  int local_14;
  int i;
  Abc_EnuMan_t *p_local;
  
  Kit_DsdPrintFromTruth((uint *)(p->pTruths + (long)p->nNodes + -1),p->nVars);
  for (local_14 = p->nVars; local_14 < p->nNodes; local_14 = local_14 + 1) {
    if (p->Polar[local_14] == 4) {
      printf("  %c=%c+%c",(ulong)(local_14 + 0x61),(ulong)(p->pFans0[local_14] + 0x61),
             (ulong)(p->pFans1[local_14] + 0x61));
    }
    else {
      pcVar1 = "";
      if (p->fCompl0[local_14] != 0) {
        pcVar1 = "!";
      }
      pcVar2 = "";
      if (p->fCompl1[local_14] != 0) {
        pcVar2 = "!";
      }
      printf("  %c=%s%c%s%c",(ulong)(local_14 + 0x61),pcVar1,(ulong)(p->pFans0[local_14] + 0x61),
             pcVar2,(ulong)(p->pFans1[local_14] + 0x61));
    }
  }
  printf("\n");
  return;
}

Assistant:

static inline void Abc_EnumPrintOne( Abc_EnuMan_t * p )
{
    int i;
    Kit_DsdPrintFromTruth( (unsigned *)(p->pTruths + p->nNodes - 1), p->nVars ); 
    for ( i = p->nVars; i < p->nNodes; i++ )
        if ( p->Polar[i] == 4 )
            printf( "  %c=%c+%c", 'a'+i, 'a'+p->pFans0[i], 'a'+p->pFans1[i] );
        else
            printf( "  %c=%s%c%s%c", 'a'+i, p->fCompl0[i]?"!":"", 'a'+p->pFans0[i], p->fCompl1[i]?"!":"", 'a'+p->pFans1[i] );
    printf( "\n" );
}